

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::EndColumns(void)

{
  ImVector<ImGuiColumnData> *this;
  ImGuiWindow *pIVar1;
  ImGuiColumns *pIVar2;
  ImVec2 IVar3;
  ImGuiContext *pIVar4;
  bool bVar5;
  ImU32 col;
  int iVar6;
  ImGuiColumnData *pIVar7;
  int n_1;
  int i;
  int n;
  int iVar8;
  ulong uVar9;
  ImGuiCol idx;
  ImGuiID id;
  uint uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined4 extraout_XMM0_Db;
  uint extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc;
  uint extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  uint extraout_XMM0_Dd_00;
  bool held;
  bool hovered;
  uint local_ac;
  undefined1 local_a8 [16];
  ulong local_98;
  ImGuiContext *g;
  ImVec2 local_88;
  ImVec2 local_80;
  ImRect column_hit_rect;
  
  g = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->WriteAccessed = true;
  pIVar2 = (pIVar1->DC).CurrentColumns;
  if (pIVar2 == (ImGuiColumns *)0x0) {
    __assert_fail("columns != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imgui_widgets.cpp"
                  ,0x1d28,"void ImGui::EndColumns()");
  }
  PopItemWidth();
  if (1 < pIVar2->Count) {
    PopClipRect();
    ImDrawList::ChannelsMerge(pIVar1->DrawList);
  }
  local_ac = pIVar2->Flags;
  fVar12 = (pIVar1->DC).CursorPos.y;
  uVar10 = -(uint)(fVar12 <= pIVar2->LineMaxY);
  fVar12 = (float)(~uVar10 & (uint)fVar12 | (uint)pIVar2->LineMaxY & uVar10);
  pIVar2->LineMaxY = fVar12;
  (pIVar1->DC).CursorPos.y = fVar12;
  if ((local_ac & 0x10) == 0) {
    (pIVar1->DC).CursorMaxPos.x = pIVar2->HostCursorMaxPosX;
  }
  if (((local_ac & 1) == 0) && (pIVar1->SkipItems == false)) {
    fVar13 = (pIVar1->ClipRect).Min.y;
    uVar10 = -(uint)(fVar13 <= pIVar2->HostCursorPosY);
    fVar11 = (pIVar1->ClipRect).Max.y;
    if (fVar11 <= fVar12) {
      fVar12 = fVar11;
    }
    fVar13 = (float)(~uVar10 & (uint)fVar13 | (uint)pIVar2->HostCursorPosY & uVar10);
    this = &pIVar2->Columns;
    local_98 = 0xffffffffffffffff;
    uVar9 = 1;
    while( true ) {
      iVar6 = pIVar2->Count;
      iVar8 = (int)uVar9;
      if (iVar6 <= iVar8) break;
      pIVar7 = ImVector<ImGuiColumnData>::operator[](this,iVar8);
      local_a8._0_4_ = (pIVar1->Pos).x;
      fVar11 = GetColumnOffset(iVar8);
      local_a8._0_4_ = fVar11 + (float)local_a8._0_4_;
      id = pIVar2->ID + iVar8;
      column_hit_rect.Min.x = (float)local_a8._0_4_ + -4.0;
      local_a8._4_4_ = extraout_XMM0_Db;
      local_a8._8_4_ = extraout_XMM0_Dc;
      local_a8._12_4_ = extraout_XMM0_Dd;
      column_hit_rect.Max.x = (float)local_a8._0_4_ + 4.0;
      column_hit_rect.Min.y = fVar13;
      column_hit_rect.Max.y = fVar12;
      KeepAliveID(id);
      bVar5 = IsClippedEx(&column_hit_rect,id,false);
      if (!bVar5) {
        hovered = false;
        held = false;
        if ((local_ac & 2) == 0) {
          ButtonBehavior(&column_hit_rect,id,&hovered,&held,0);
          if (hovered == false) {
            if ((held & 1U) != 0) {
              g->MouseCursor = 4;
              goto LAB_002f2243;
            }
          }
          else {
            g->MouseCursor = 4;
            if ((held & 1U) != 0) {
LAB_002f2243:
              if ((pIVar7->Flags & 2) == 0) {
                local_98 = uVar9;
              }
              local_98 = local_98 & 0xffffffff;
            }
          }
        }
        idx = hovered + 0x1b;
        if ((held & 1U) != 0) {
          idx = 0x1d;
        }
        col = GetColorU32(idx,1.0);
        local_88.x = (float)(int)(float)local_a8._0_4_;
        local_88.y = fVar12;
        local_80.x = local_88.x;
        local_80.y = fVar13 + 1.0;
        ImDrawList::AddLine(pIVar1->DrawList,&local_80,&local_88,col,1.0);
      }
      uVar9 = (ulong)(iVar8 + 1);
    }
    iVar8 = (int)local_98;
    if (iVar8 != -1) {
      if (pIVar2->IsBeingResized == false) {
        for (i = 0; i <= iVar6; i = i + 1) {
          pIVar7 = ImVector<ImGuiColumnData>::operator[](this,i);
          local_a8._0_4_ = pIVar7->OffsetNorm;
          pIVar7 = ImVector<ImGuiColumnData>::operator[](this,i);
          pIVar7->OffsetNormBeforeResize = (float)local_a8._0_4_;
          iVar6 = pIVar2->Count;
        }
      }
      pIVar2->IsBeingResized = true;
      pIVar4 = GImGui;
      if (iVar8 < 1) {
        __assert_fail("column_index > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imgui_widgets.cpp"
                      ,0x1c11,"float GetDraggedColumnOffset(ImGuiColumns *, int)");
      }
      if (GImGui->ActiveId != pIVar2->ID + iVar8) {
        __assert_fail("g.ActiveId == columns->ID + ImGuiID(column_index)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imgui_widgets.cpp"
                      ,0x1c12,"float GetDraggedColumnOffset(ImGuiColumns *, int)");
      }
      local_a8 = ZEXT416((uint)((((GImGui->IO).MousePos.x - (GImGui->ActiveIdClickOffset).x) + 4.0)
                               - (GImGui->CurrentWindow->Pos).x));
      fVar12 = GetColumnOffset(iVar8 + -1);
      fVar12 = fVar12 + (pIVar4->Style).ColumnsMinSpacing;
      uVar10 = -(uint)(fVar12 <= (float)local_a8._0_4_);
      fVar12 = (float)(~uVar10 & (uint)fVar12 | local_a8._0_4_ & uVar10);
      if ((pIVar2->Flags & 4) != 0) {
        local_a8._4_4_ = local_a8._4_4_ & extraout_XMM0_Db_00;
        local_a8._0_4_ = fVar12;
        local_a8._8_4_ = local_a8._8_4_ & extraout_XMM0_Dc_00;
        local_a8._12_4_ = local_a8._12_4_ & extraout_XMM0_Dd_00;
        fVar13 = GetColumnOffset(iVar8 + 1);
        fVar13 = fVar13 - (pIVar4->Style).ColumnsMinSpacing;
        fVar12 = (float)local_a8._0_4_;
        if (fVar13 <= (float)local_a8._0_4_) {
          fVar12 = fVar13;
        }
      }
      SetColumnOffset(iVar8,fVar12);
    }
    bVar5 = iVar8 != -1;
  }
  else {
    bVar5 = false;
  }
  pIVar2->IsBeingResized = bVar5;
  IVar3 = (pIVar2->HostWorkRect).Max;
  (pIVar1->WorkRect).Min = (pIVar2->HostWorkRect).Min;
  (pIVar1->WorkRect).Max = IVar3;
  (pIVar1->DC).CurrentColumns = (ImGuiColumns *)0x0;
  (pIVar1->DC).ColumnsOffset.x = 0.0;
  (pIVar1->DC).CursorPos.x = (float)(int)((pIVar1->Pos).x + (pIVar1->DC).Indent.x + 0.0);
  return;
}

Assistant:

void ImGui::EndColumns()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    ImGuiColumns* columns = window->DC.CurrentColumns;
    IM_ASSERT(columns != NULL);

    PopItemWidth();
    if (columns->Count > 1)
    {
        PopClipRect();
        window->DrawList->ChannelsMerge();
    }

    const ImGuiColumnsFlags flags = columns->Flags;
    columns->LineMaxY = ImMax(columns->LineMaxY, window->DC.CursorPos.y);
    window->DC.CursorPos.y = columns->LineMaxY;
    if (!(flags & ImGuiColumnsFlags_GrowParentContentsSize))
        window->DC.CursorMaxPos.x = columns->HostCursorMaxPosX;  // Restore cursor max pos, as columns don't grow parent

    // Draw columns borders and handle resize
    // The IsBeingResized flag ensure we preserve pre-resize columns width so back-and-forth are not lossy
    bool is_being_resized = false;
    if (!(flags & ImGuiColumnsFlags_NoBorder) && !window->SkipItems)
    {
        // We clip Y boundaries CPU side because very long triangles are mishandled by some GPU drivers.
        const float y1 = ImMax(columns->HostCursorPosY, window->ClipRect.Min.y);
        const float y2 = ImMin(window->DC.CursorPos.y, window->ClipRect.Max.y);
        int dragging_column = -1;
        for (int n = 1; n < columns->Count; n++)
        {
            ImGuiColumnData* column = &columns->Columns[n];
            float x = window->Pos.x + GetColumnOffset(n);
            const ImGuiID column_id = columns->ID + ImGuiID(n);
            const float column_hit_hw = COLUMNS_HIT_RECT_HALF_WIDTH;
            const ImRect column_hit_rect(ImVec2(x - column_hit_hw, y1), ImVec2(x + column_hit_hw, y2));
            KeepAliveID(column_id);
            if (IsClippedEx(column_hit_rect, column_id, false))
                continue;

            bool hovered = false, held = false;
            if (!(flags & ImGuiColumnsFlags_NoResize))
            {
                ButtonBehavior(column_hit_rect, column_id, &hovered, &held);
                if (hovered || held)
                    g.MouseCursor = ImGuiMouseCursor_ResizeEW;
                if (held && !(column->Flags & ImGuiColumnsFlags_NoResize))
                    dragging_column = n;
            }

            // Draw column
            const ImU32 col = GetColorU32(held ? ImGuiCol_SeparatorActive : hovered ? ImGuiCol_SeparatorHovered : ImGuiCol_Separator);
            const float xi = (float)(int)x;
            window->DrawList->AddLine(ImVec2(xi, y1 + 1.0f), ImVec2(xi, y2), col);
        }

        // Apply dragging after drawing the column lines, so our rendered lines are in sync with how items were displayed during the frame.
        if (dragging_column != -1)
        {
            if (!columns->IsBeingResized)
                for (int n = 0; n < columns->Count + 1; n++)
                    columns->Columns[n].OffsetNormBeforeResize = columns->Columns[n].OffsetNorm;
            columns->IsBeingResized = is_being_resized = true;
            float x = GetDraggedColumnOffset(columns, dragging_column);
            SetColumnOffset(dragging_column, x);
        }
    }
    columns->IsBeingResized = is_being_resized;

    window->WorkRect = columns->HostWorkRect;
    window->DC.CurrentColumns = NULL;
    window->DC.ColumnsOffset.x = 0.0f;
    window->DC.CursorPos.x = (float)(int)(window->Pos.x + window->DC.Indent.x + window->DC.ColumnsOffset.x);
}